

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Pos af_cjk_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_UInt base_flags,
                 FT_UInt stem_flags)

{
  long lVar1;
  uint uVar2;
  int in_register_0000000c;
  uint uVar3;
  AF_CJKMetrics metrics;
  undefined4 in_register_00000034;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  uVar5 = CONCAT44(in_register_0000000c,base_flags);
  if (((ulong)hints & 4) == 0) {
    return uVar5;
  }
  lVar8 = (width & 0xffffffffU) * 0x3838;
  lVar1 = CONCAT44(in_register_00000034,dim) + lVar8;
  uVar6 = -uVar5;
  if (0 < (long)uVar5) {
    uVar6 = uVar5;
  }
  if ((int)width == 1) {
    uVar5 = (ulong)hints & 2;
  }
  else {
    uVar5 = (ulong)hints & 1;
  }
  if (uVar5 == 0) {
    if (*(int *)(lVar1 + 0x60) != 0) {
      uVar5 = *(ulong *)(lVar1 + 0x70);
      uVar4 = uVar6 - uVar5;
      uVar7 = -uVar4;
      if (0 < (long)uVar4) {
        uVar7 = uVar4;
      }
      if (uVar7 < 0x28) {
        uVar6 = 0x30;
        if (0x30 < (long)uVar5) {
          uVar6 = uVar5;
        }
        goto LAB_0018263c;
      }
    }
    uVar2 = (uint)uVar6;
    if (uVar6 < 0x36) {
      uVar6 = uVar6 + (0x36 - uVar2 >> 1);
    }
    else if (uVar6 < 0xc0) {
      uVar3 = uVar2 & 0x3f;
      if (9 < (ulong)uVar3) {
        if (uVar3 < 0x16) {
          uVar6 = (ulong)(uVar2 & 0xc0) | 10;
        }
        else if ((ulong)uVar3 - 0x2a < 0xc) {
          uVar6 = (ulong)(uVar2 & 0xc0) | 0x36;
        }
      }
    }
    goto LAB_0018263c;
  }
  uVar5 = uVar6;
  if ((ulong)*(uint *)(lVar1 + 0x60) == 0) {
    uVar7 = uVar6 + 0x20 & 0x7fffffffffffffc0;
LAB_001825ad:
    if ((long)(uVar7 | 0x30) <= (long)uVar6) {
      uVar5 = uVar6;
    }
  }
  else {
    lVar9 = 0x62;
    lVar10 = 0;
    do {
      uVar7 = *(ulong *)(lVar8 + CONCAT44(in_register_00000034,dim) + 0x70 + lVar10);
      lVar11 = uVar6 - uVar7;
      lVar12 = -lVar11;
      if (0 < lVar11) {
        lVar12 = lVar11;
      }
      if (lVar12 < lVar9) {
        uVar5 = uVar7;
        lVar9 = lVar12;
      }
      lVar10 = lVar10 + 0x18;
    } while ((ulong)*(uint *)(lVar1 + 0x60) * 0x18 != lVar10);
    uVar7 = uVar5 + 0x20 & 0xffffffffffffffc0;
    if ((long)uVar5 <= (long)uVar6) goto LAB_001825ad;
    if ((long)uVar6 <= (long)(uVar7 - 0x30)) {
      uVar5 = uVar6;
    }
  }
  if ((int)width == 1) {
    uVar6 = 0x40;
    if ((long)uVar5 < 0x40) goto LAB_0018263c;
    uVar5 = uVar5 + 0x10;
  }
  else {
    if (((ulong)hints & 8) == 0) {
      if ((long)uVar5 < 0x30) {
        uVar6 = (long)(uVar5 + 0x40) >> 1;
        goto LAB_0018263c;
      }
      if (uVar5 < 0x80) {
        uVar6 = (ulong)((int)uVar5 + 0x16U & 0xc0);
        goto LAB_0018263c;
      }
    }
    else {
      uVar6 = 0x40;
      if ((long)uVar5 < 0x40) goto LAB_0018263c;
    }
    uVar5 = uVar5 + 0x20;
  }
  uVar6 = uVar5 & 0x7fffffffffffffc0;
LAB_0018263c:
  uVar5 = -uVar6;
  if (-1 < in_register_0000000c) {
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

static FT_Pos
  af_cjk_compute_stem_width( AF_GlyphHints  hints,
                             AF_Dimension   dim,
                             FT_Pos         width,
                             FT_UInt        base_flags,
                             FT_UInt        stem_flags )
  {
    AF_CJKMetrics  metrics  = (AF_CJKMetrics)hints->metrics;
    AF_CJKAxis     axis     = &metrics->axis[dim];
    FT_Pos         dist     = width;
    FT_Int         sign     = 0;
    FT_Bool        vertical = FT_BOOL( dim == AF_DIMENSION_VERT );

    FT_UNUSED( base_flags );
    FT_UNUSED( stem_flags );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      if ( axis->width_count > 0 )
      {
        if ( FT_ABS( dist - axis->widths[0].cur ) < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }
      }

      if ( dist < 54 )
        dist += ( 54 - dist ) / 2;
      else if ( dist < 3 * 64 )
      {
        FT_Pos  delta;


        delta  = dist & 63;
        dist  &= -64;

        if ( delta < 10 )
          dist += delta;
        else if ( delta < 22 )
          dist += 10;
        else if ( delta < 42 )
          dist += delta;
        else if ( delta < 54 )
          dist += 54;
        else
          dist += delta;
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      dist = af_cjk_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
            dist = ( dist + 22 ) & ~63;
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }